

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall common_log::set_colors(common_log *this,bool colors)

{
  reference ppcVar1;
  size_type sVar2;
  byte in_SIL;
  common_log *in_RDI;
  size_t i;
  ulong local_18;
  
  pause(in_RDI);
  if ((in_SIL & 1) == 0) {
    for (local_18 = 0;
        sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&g_col),
        local_18 < sVar2; local_18 = local_18 + 1) {
      ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&g_col,local_18);
      *ppcVar1 = "";
    }
  }
  else {
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,0);
    *ppcVar1 = "\x1b[0m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,1);
    *ppcVar1 = "\x1b[1m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,2);
    *ppcVar1 = "\x1b[31m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,3);
    *ppcVar1 = "\x1b[32m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,4);
    *ppcVar1 = "\x1b[33m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,5);
    *ppcVar1 = "\x1b[34m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,6);
    *ppcVar1 = "\x1b[35m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,7);
    *ppcVar1 = "\x1b[36m";
    ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,8);
    *ppcVar1 = "\x1b[37m";
  }
  resume((common_log *)i);
  return;
}

Assistant:

void set_colors(bool colors) {
        pause();

        if (colors) {
            g_col[COMMON_LOG_COL_DEFAULT] = LOG_COL_DEFAULT;
            g_col[COMMON_LOG_COL_BOLD]    = LOG_COL_BOLD;
            g_col[COMMON_LOG_COL_RED]     = LOG_COL_RED;
            g_col[COMMON_LOG_COL_GREEN]   = LOG_COL_GREEN;
            g_col[COMMON_LOG_COL_YELLOW]  = LOG_COL_YELLOW;
            g_col[COMMON_LOG_COL_BLUE]    = LOG_COL_BLUE;
            g_col[COMMON_LOG_COL_MAGENTA] = LOG_COL_MAGENTA;
            g_col[COMMON_LOG_COL_CYAN]    = LOG_COL_CYAN;
            g_col[COMMON_LOG_COL_WHITE]   = LOG_COL_WHITE;
        } else {
            for (size_t i = 0; i < g_col.size(); i++) {
                g_col[i] = "";
            }
        }

        resume();
    }